

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullptr_test.c
# Opt level: O2

int main(void)

{
  putchar(10);
  nullptr_test(3);
  nullptr_test(4);
  nullptr_test(2);
  putchar(10);
  return 0;
}

Assistant:

int
main (void)
{
	puts("");

	nullptr_test (SRC_ZERO_ORDER_HOLD) ;
	nullptr_test (SRC_LINEAR) ;
#ifdef ENABLE_SINC_FAST_CONVERTER
	nullptr_test (SRC_SINC_FASTEST) ;
#endif
	puts("");

	return 0 ;
}